

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_parallel_game_of_life.cpp
# Opt level: O3

void __thiscall App::ResizeTables(App *this,int w,int h)

{
  Table2D<char> *this_00;
  uint uVar1;
  size_t __i;
  long lVar2;
  ulong uVar3;
  mt19937 mt;
  param_type local_13d0;
  anon_class_16_2_7fa271ba local_13c8;
  mt19937 local_13b8;
  
  if ((h | w) < 0) {
    w = 0;
    h = 0;
  }
  this->idx = 0;
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffffffffff00;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)&this->table,(long)h * (long)w,
             (value_type *)&local_13b8);
  (this->table)._M_elems[0].w = w;
  (this->table)._M_elems[0].h = h;
  this_00 = (this->table)._M_elems + 1;
  local_13b8._M_x[0] = local_13b8._M_x[0] & 0xffffffffffffff00;
  std::vector<char,_std::allocator<char>_>::resize
            (&this_00->data,(long)h * (long)w,(value_type *)&local_13b8);
  (this->table)._M_elems[1].w = w;
  (this->table)._M_elems[1].h = h;
  local_13b8._M_x[0] = 0x2a;
  lVar2 = 1;
  uVar3 = 0x2a;
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar2);
    local_13b8._M_x[lVar2] = uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x270);
  local_13b8._M_p = 0x270;
  local_13c8.d = (uniform_real_distribution<float> *)&local_13d0;
  local_13d0._M_a = 0.0;
  local_13d0._M_b = 1.0;
  local_13c8.mt = &local_13b8;
  Table2D<char>::fill1<App::ResizeTables(int,int)::_lambda(int)_1_>
            ((this->table)._M_elems,&local_13c8);
  uVar1 = (this->table)._M_elems[1].h * (this->table)._M_elems[1].w;
  if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      (this_00->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar3] = '\0';
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return;
}

Assistant:

void ResizeTables(int w, int h)
	{
		if(w < 0 || h < 0){ w = h = 0; }
		idx = 0;
		table[0].resize(w, h);
		table[1].resize(w, h);

		{
			std::mt19937 mt(42);
			std::uniform_real_distribution<float> d(0.0, 1.0f);
			table[0].fill1([&](int)->char{ return d(mt) < 0.5 ? 0 : 1; }); 
			table[1].fill1([ ](int)->char{ return 0; });
		}
	}